

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

int check_response_cache(CManager_conflict cm,stone_type stone,action_class stage,event_item *event)

{
  int iVar1;
  CMincoming_format_list p_Var2;
  long lVar3;
  long lVar4;
  undefined4 in_register_00000014;
  int iVar5;
  long lVar6;
  int iVar7;
  
  iVar5 = (int)stone;
  lVar6 = 0;
  lVar4 = 0;
  do {
    if (cm->in_format_count <= lVar4) {
      return -1;
    }
    p_Var2 = cm->in_formats;
    lVar3 = *(long *)((long)&p_Var2->format + lVar6);
    if (lVar3 == *(long *)(CONCAT44(in_register_00000014,stage) + 0x30)) {
      iVar1 = *(int *)((long)&p_Var2->handler + lVar6 + 4);
      if (iVar1 == 0) {
        iVar7 = iVar5;
        if (*(int *)((long)&p_Var2->handler + lVar6) != iVar5) goto LAB_00131c88;
      }
      else {
        iVar7 = *(int *)((long)&p_Var2->handler + lVar6);
      }
      if ((iVar7 == iVar5) || (iVar5 == 1 && iVar7 == 0)) {
        if (*(int *)(CONCAT44(in_register_00000014,stage) + 4) != 0) goto LAB_00131c80;
        if ((iVar1 != 7) || (*(long *)((long)&p_Var2->local_prior_format + lVar6) != lVar3))
        goto LAB_00131c9d;
      }
    }
    else if (lVar3 == 0) {
LAB_00131c80:
      if (*(int *)((long)&p_Var2->client_data + lVar6 + 4) == 0) {
LAB_00131c9d:
        return (int)lVar4;
      }
    }
LAB_00131c88:
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x30;
  } while( true );
}

Assistant:

static int
check_response_cache(CManager cm, stone_type stone, action_class stage, event_item *event)
{
    int i;
    for (i=0; i < stone->response_cache_count; i++) {
//	CMtrace_out(cm, EVerbose, "Response cache %d reference_format is %p (%s), Type %s, stage is %d, requires_decoded is %d\n", i, 
//		    stone->response_cache[i].reference_format, 
//		    global_name_of_FMFormat(stone->response_cache[i].reference_format), action_str[stone->response_cache[i].action_type],
//		    stone->response_cache[i].stage, stone->response_cache[i].requires_decoded);
	if (stone->response_cache[i].reference_format == event->reference_format) {
	    /* 
	     * if the event is encoded and the action requires decoded data,
	     * this action won't do.  Scan further for decode action or 
	     * generate one with response_determination().
	     */
	    if ((stone->response_cache[i].action_type == Action_NoAction) &&
		(stage != stone->response_cache[i].stage)) {
		/* don't return NoAction unless we're querying this exact stage */
		continue;
	    }
	    if (!compatible_stages(stage, stone->response_cache[i].stage)) {
		continue;
	    }
	    if (event->event_encoded && stone->response_cache[i].requires_decoded) {
		continue;
	    }
	    if (!event->event_encoded &&
	    	(stone->response_cache[i].action_type == Action_Decode) &&
	    	(stone->response_cache[i].o.decode.target_reference_format == event->reference_format)) {
	    	continue;
	    }
	    return i;
	} else if (stone->response_cache[i].reference_format == NULL &&
                   !stone->response_cache[i].requires_decoded) {
            return i;
        }
    }
    return -1;
}